

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

Cut_Oracle_t * Cut_OracleStart(Cut_Man_t *pMan)

{
  int iVar1;
  Cut_Oracle_t *__s;
  Vec_Ptr_t *pVVar2;
  Extra_MmFixed_t *pEVar3;
  Cut_Oracle_t *p;
  Cut_Man_t *pMan_local;
  
  if ((2 < pMan->pParams->nVarsMax) && (pMan->pParams->nVarsMax < 0xd)) {
    if (pMan->pParams->fRecord == 0) {
      __assert_fail("pMan->pParams->fRecord",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                    ,0x4e,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
    }
    __s = (Cut_Oracle_t *)malloc(0x68);
    memset(__s,0,0x68);
    __s->pParams = pMan->pParams;
    __s->vNodeCuts = pMan->vNodeCuts;
    pMan->vNodeCuts = (Vec_Int_t *)0x0;
    __s->vNodeStarts = pMan->vNodeStarts;
    pMan->vNodeStarts = (Vec_Int_t *)0x0;
    __s->vCutPairs = pMan->vCutPairs;
    pMan->vCutPairs = (Vec_Int_t *)0x0;
    pVVar2 = Vec_PtrAlloc(__s->pParams->nIdsMax);
    __s->vCutsNew = pVVar2;
    Vec_PtrFill(__s->vCutsNew,__s->pParams->nIdsMax,(void *)0x0);
    pVVar2 = Vec_PtrAlloc(100);
    __s->vCuts0 = pVVar2;
    pVVar2 = Vec_PtrAlloc(100);
    __s->vCuts1 = pVVar2;
    __s->EntrySize = __s->pParams->nVarsMax * 4 + 0x18;
    if (__s->pParams->fTruth != 0) {
      if (__s->pParams->nVarsMax < 9) {
        iVar1 = Cut_TruthWords(__s->pParams->nVarsMax);
        __s->nTruthWords = iVar1;
        __s->EntrySize = __s->EntrySize + __s->nTruthWords * 4;
      }
      else {
        __s->pParams->fTruth = 0;
        printf("Skipping computation of truth table for more than 8 inputs.\n");
      }
    }
    pEVar3 = Extra_MmFixedStart(__s->EntrySize);
    __s->pMmCuts = pEVar3;
    return __s;
  }
  __assert_fail("pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutOracle.c"
                ,0x4d,"Cut_Oracle_t *Cut_OracleStart(Cut_Man_t *)");
}

Assistant:

Cut_Oracle_t * Cut_OracleStart( Cut_Man_t * pMan )
{
    Cut_Oracle_t * p;

    assert( pMan->pParams->nVarsMax >= 3 && pMan->pParams->nVarsMax <= CUT_SIZE_MAX );
    assert( pMan->pParams->fRecord );

    p = ABC_ALLOC( Cut_Oracle_t, 1 );
    memset( p, 0, sizeof(Cut_Oracle_t) );

    // set and correct parameters
    p->pParams     = pMan->pParams;

    // transfer the recording info
    p->vNodeCuts   = pMan->vNodeCuts;    pMan->vNodeCuts   = NULL;
    p->vNodeStarts = pMan->vNodeStarts;  pMan->vNodeStarts = NULL;
    p->vCutPairs   = pMan->vCutPairs;    pMan->vCutPairs   = NULL;

    // prepare storage for cuts
    p->vCutsNew = Vec_PtrAlloc( p->pParams->nIdsMax );
    Vec_PtrFill( p->vCutsNew, p->pParams->nIdsMax, NULL );
    p->vCuts0 = Vec_PtrAlloc( 100 );
    p->vCuts1 = Vec_PtrAlloc( 100 );

    // entry size
    p->EntrySize = sizeof(Cut_Cut_t) + p->pParams->nVarsMax * sizeof(int);
    if ( p->pParams->fTruth )
    {
        if ( p->pParams->nVarsMax > 8 )
        {
            p->pParams->fTruth = 0;
            printf( "Skipping computation of truth table for more than 8 inputs.\n" );
        }
        else
        {
            p->nTruthWords = Cut_TruthWords( p->pParams->nVarsMax );
            p->EntrySize += p->nTruthWords * sizeof(unsigned);
        }
    }
    // memory for cuts
    p->pMmCuts = Extra_MmFixedStart( p->EntrySize );
    return p;
}